

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O0

void __thiscall
duckdb::UnaryAggregateHeap<int,_duckdb::GreaterThan>::Insert
          (UnaryAggregateHeap<int,_duckdb::GreaterThan> *this,ArenaAllocator *allocator,int *value)

{
  ulong uVar1;
  bool bVar2;
  HeapEntry<int> *in_RDX;
  ArenaAllocator *in_RSI;
  _func_bool_HeapEntry<int>_ptr_HeapEntry<int>_ptr *in_RDI;
  
  if (*(ulong *)(in_RDI + 0x10) < *(ulong *)in_RDI) {
    uVar1 = *(ulong *)(in_RDI + 0x10);
    *(ulong *)(in_RDI + 0x10) = uVar1 + 1;
    HeapEntry<int>::Assign
              ((HeapEntry<int> *)(*(ulong *)(in_RDI + 8) + uVar1 * 4),in_RSI,&in_RDX->value);
    ::std::
    push_heap<duckdb::HeapEntry<int>*,bool(*)(duckdb::HeapEntry<int>const&,duckdb::HeapEntry<int>const&)>
              ((HeapEntry<int> *)in_RSI,in_RDX,in_RDI);
  }
  else {
    bVar2 = GreaterThan::Operation<int>(&in_RDX->value,*(int **)(in_RDI + 8));
    if (bVar2) {
      ::std::
      pop_heap<duckdb::HeapEntry<int>*,bool(*)(duckdb::HeapEntry<int>const&,duckdb::HeapEntry<int>const&)>
                ((HeapEntry<int> *)in_RSI,in_RDX,in_RDI);
      HeapEntry<int>::Assign
                ((HeapEntry<int> *)(*(long *)(in_RDI + 8) + (*(long *)(in_RDI + 0x10) + -1) * 4),
                 in_RSI,&in_RDX->value);
      ::std::
      push_heap<duckdb::HeapEntry<int>*,bool(*)(duckdb::HeapEntry<int>const&,duckdb::HeapEntry<int>const&)>
                ((HeapEntry<int> *)in_RSI,in_RDX,in_RDI);
    }
  }
  return;
}

Assistant:

void Insert(ArenaAllocator &allocator, const T &value) {
		D_ASSERT(capacity != 0); // must be initialized

		// If the heap is not full, insert the value into a new slot
		if (size < capacity) {
			heap[size++].Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		// If the heap is full, check if the value is greater than the smallest value in the heap
		// If it is, assign the new value to the slot and re-heapify
		else if (T_COMPARATOR::Operation(value, heap[0].value)) {
			std::pop_heap(heap, heap + size, Compare);
			heap[size - 1].Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		D_ASSERT(std::is_heap(heap, heap + size, Compare));
	}